

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O0

int i2cReadWordData(uint handle,uint reg)

{
  my_smbus_data *pmVar1;
  uint uVar2;
  char *pcVar3;
  uint in_ESI;
  uint in_EDI;
  int status;
  my_smbus_data data;
  my_smbus_data *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  ushort in_stack_ffffffffffffffd2;
  int in_stack_ffffffffffffffd4;
  uint local_4;
  
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals & 0x400) == 0)) {
    in_stack_ffffffffffffffc0 = _stderr;
    pcVar3 = myTimeStamp();
    fprintf((FILE *)in_stack_ffffffffffffffc0,"%s %s: handle=%d reg=%d\n",pcVar3,"i2cReadWordData",
            (ulong)in_EDI,(ulong)in_ESI);
  }
  pmVar1 = _stderr;
  if (libInitialised == 0) {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar3 = myTimeStamp();
      fprintf((FILE *)pmVar1,"%s %s: pigpio uninitialised, call gpioInitialise()\n",pcVar3,
              "i2cReadWordData");
    }
    local_4 = 0xffffffe1;
  }
  else if (in_EDI < 0x40) {
    if (i2cInfo[in_EDI].state == 2) {
      if ((i2cInfo[in_EDI].funcs & 0x200000) == 0) {
        if ((gpioCfg.internals & 0x400) == 0) {
          pcVar3 = myTimeStamp();
          fprintf((FILE *)pmVar1,"%s %s: SMBUS command not supported by driver\n",pcVar3,
                  "i2cReadWordData");
        }
        local_4 = 0xffffff95;
      }
      else if (in_ESI < 0x100) {
        uVar2 = my_smbus_access(in_stack_ffffffffffffffd4,(char)(in_stack_ffffffffffffffd2 >> 8),
                                (uint8_t)in_stack_ffffffffffffffd2,in_stack_ffffffffffffffcc,
                                in_stack_ffffffffffffffc0);
        pmVar1 = _stderr;
        if ((int)uVar2 < 0) {
          if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals & 0x400) == 0)) {
            pcVar3 = myTimeStamp();
            fprintf((FILE *)pmVar1,"%s %s: error=%d (%m)\n",pcVar3,"i2cReadWordData",(ulong)uVar2);
          }
          local_4 = 0xffffffad;
        }
        else {
          local_4 = (uint)in_stack_ffffffffffffffd2;
        }
      }
      else {
        if ((gpioCfg.internals & 0x400) == 0) {
          pcVar3 = myTimeStamp();
          fprintf((FILE *)pmVar1,"%s %s: bad reg (%d)\n",pcVar3,"i2cReadWordData",(ulong)in_ESI);
        }
        local_4 = 0xffffffaf;
      }
    }
    else {
      if ((gpioCfg.internals & 0x400) == 0) {
        pcVar3 = myTimeStamp();
        fprintf((FILE *)pmVar1,"%s %s: bad handle (%d)\n",pcVar3,"i2cReadWordData",(ulong)in_EDI);
      }
      local_4 = 0xffffffe7;
    }
  }
  else {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar3 = myTimeStamp();
      fprintf((FILE *)pmVar1,"%s %s: bad handle (%d)\n",pcVar3,"i2cReadWordData",(ulong)in_EDI);
    }
    local_4 = 0xffffffe7;
  }
  return local_4;
}

Assistant:

int i2cReadWordData(unsigned handle, unsigned reg)
{
   union my_smbus_data data;
   int status;

   DBG(DBG_USER, "handle=%d reg=%d", handle, reg);

   CHECK_INITED;

   if (handle >= PI_I2C_SLOTS)
      SOFT_ERROR(PI_BAD_HANDLE, "bad handle (%d)", handle);

   if (i2cInfo[handle].state != PI_I2C_OPENED)
      SOFT_ERROR(PI_BAD_HANDLE, "bad handle (%d)", handle);

   if ((i2cInfo[handle].funcs & PI_I2C_FUNC_SMBUS_READ_WORD_DATA) == 0)
      SOFT_ERROR(PI_BAD_SMBUS_CMD, "SMBUS command not supported by driver");

   if (reg > 0xFF)
      SOFT_ERROR(PI_BAD_PARAM, "bad reg (%d)", reg);

   status = (my_smbus_access(
      i2cInfo[handle].fd,
      PI_I2C_SMBUS_READ,
      reg,
      PI_I2C_SMBUS_WORD_DATA,
      &data));

   if (status < 0)
   {
      DBG(DBG_USER, "error=%d (%m)", status);
      return PI_I2C_READ_FAILED;
   }

   return 0xFFFF & data.word;
}